

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i,real a)

{
  undefined1 auVar1 [16];
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint in_XMM0_Da;
  int64_t j;
  long local_28;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x3a,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  if (in_RDX < in_RSI[1]) {
    if (*in_RDI == in_RSI[2]) {
      for (local_28 = 0; local_28 < in_RSI[2]; local_28 = local_28 + 1) {
        auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(*in_RSI + (in_RDX * in_RSI[2] + local_28) * 4)),
                                 ZEXT416(in_XMM0_Da),ZEXT416(*(uint *)(in_RDI[1] + local_28 * 4)));
        *(int *)(in_RDI[1] + local_28 * 4) = auVar1._0_4_;
      }
      return;
    }
    __assert_fail("m_ == A.n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x3c,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  __assert_fail("i < A.m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,0x3b,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i, real a) {
  assert(i >= 0);
  assert(i < A.m_);
  assert(m_ == A.n_);
  for (int64_t j = 0; j < A.n_; j++) {
    data_[j] += a * A.data_[i * A.n_ + j];
  }
}